

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostream.h
# Opt level: O2

streamsize __thiscall
fmt::v6::internal::formatbuf<char>::xsputn(formatbuf<char> *this,char *s,streamsize count)

{
  buffer<char>::append<char>(this->buffer_,s,s + count);
  return count;
}

Assistant:

std::streamsize xsputn(const Char* s, std::streamsize count) FMT_OVERRIDE {
    buffer_.append(s, s + count);
    return count;
  }